

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

string * GetTargetPropertyOrDefault
                   (string *__return_storage_ptr__,cmGeneratorTarget *target,string *property,
                   string *defaultValue)

{
  cmValue cVar1;
  
  cVar1 = cmGeneratorTarget::GetProperty(target,property);
  if (cVar1.Value == (string *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)defaultValue);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)cVar1.Value);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GetTargetPropertyOrDefault(cmGeneratorTarget const* target,
                                              std::string const& property,
                                              std::string defaultValue)
{
  if (cmValue name = target->GetProperty(property)) {
    return *name;
  }
  return defaultValue;
}